

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::default_socket_options(socket_t sock)

{
  int in_EAX;
  int in_EDI;
  int unaff_retaddr;
  
  detail::set_socket_opt(sock,unaff_retaddr,in_EDI,in_EAX);
  return;
}

Assistant:

inline void default_socket_options(socket_t sock) {
  detail::set_socket_opt(sock, SOL_SOCKET,
#ifdef SO_REUSEPORT
                         SO_REUSEPORT,
#else
                         SO_REUSEADDR,
#endif
                         1);
}